

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

int mbedtls_sha256(uchar *input,size_t ilen,uchar *output,int is224)

{
  int iVar1;
  mbedtls_sha256_context local_78;
  
  if (is224 == 0) {
    local_78.buffer[0x30] = '\0';
    local_78.buffer[0x31] = '\0';
    local_78.buffer[0x32] = '\0';
    local_78.buffer[0x33] = '\0';
    local_78.buffer[0x34] = '\0';
    local_78.buffer[0x35] = '\0';
    local_78.buffer[0x36] = '\0';
    local_78.buffer[0x37] = '\0';
    local_78.buffer[0x38] = '\0';
    local_78.buffer[0x39] = '\0';
    local_78.buffer[0x3a] = '\0';
    local_78.buffer[0x3b] = '\0';
    local_78.buffer[0x3c] = '\0';
    local_78.buffer[0x3d] = '\0';
    local_78.buffer[0x3e] = '\0';
    local_78.buffer[0x3f] = '\0';
    local_78.buffer[0x20] = '\0';
    local_78.buffer[0x21] = '\0';
    local_78.buffer[0x22] = '\0';
    local_78.buffer[0x23] = '\0';
    local_78.buffer[0x24] = '\0';
    local_78.buffer[0x25] = '\0';
    local_78.buffer[0x26] = '\0';
    local_78.buffer[0x27] = '\0';
    local_78.buffer[0x28] = '\0';
    local_78.buffer[0x29] = '\0';
    local_78.buffer[0x2a] = '\0';
    local_78.buffer[0x2b] = '\0';
    local_78.buffer[0x2c] = '\0';
    local_78.buffer[0x2d] = '\0';
    local_78.buffer[0x2e] = '\0';
    local_78.buffer[0x2f] = '\0';
    local_78.buffer[0x10] = '\0';
    local_78.buffer[0x11] = '\0';
    local_78.buffer[0x12] = '\0';
    local_78.buffer[0x13] = '\0';
    local_78.buffer[0x14] = '\0';
    local_78.buffer[0x15] = '\0';
    local_78.buffer[0x16] = '\0';
    local_78.buffer[0x17] = '\0';
    local_78.buffer[0x18] = '\0';
    local_78.buffer[0x19] = '\0';
    local_78.buffer[0x1a] = '\0';
    local_78.buffer[0x1b] = '\0';
    local_78.buffer[0x1c] = '\0';
    local_78.buffer[0x1d] = '\0';
    local_78.buffer[0x1e] = '\0';
    local_78.buffer[0x1f] = '\0';
    local_78.buffer[0] = '\0';
    local_78.buffer[1] = '\0';
    local_78.buffer[2] = '\0';
    local_78.buffer[3] = '\0';
    local_78.buffer[4] = '\0';
    local_78.buffer[5] = '\0';
    local_78.buffer[6] = '\0';
    local_78.buffer[7] = '\0';
    local_78.buffer[8] = '\0';
    local_78.buffer[9] = '\0';
    local_78.buffer[10] = '\0';
    local_78.buffer[0xb] = '\0';
    local_78.buffer[0xc] = '\0';
    local_78.buffer[0xd] = '\0';
    local_78.buffer[0xe] = '\0';
    local_78.buffer[0xf] = '\0';
    local_78.total[0] = 0;
    local_78.total[1] = 0;
    local_78.state[0] = 0x6a09e667;
    local_78.state[1] = 0xbb67ae85;
    local_78.state[2] = 0x3c6ef372;
    local_78.state[3] = 0xa54ff53a;
    local_78.state[4] = 0x510e527f;
    local_78.state[5] = 0x9b05688c;
    local_78.state[6] = 0x1f83d9ab;
    local_78.state[7] = 0x5be0cd19;
    iVar1 = mbedtls_sha256_update(&local_78,input,ilen);
    if (iVar1 == 0) {
      mbedtls_sha256_finish(&local_78,output);
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
    }
    mbedtls_sha256_free(&local_78);
  }
  else {
    iVar1 = -0x74;
  }
  return iVar1;
}

Assistant:

int mbedtls_sha256(const unsigned char *input,
                   size_t ilen,
                   unsigned char *output,
                   int is224)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_sha256_context ctx;

#if defined(MBEDTLS_SHA224_C) && defined(MBEDTLS_SHA256_C)
    if (is224 != 0 && is224 != 1) {
        return MBEDTLS_ERR_SHA256_BAD_INPUT_DATA;
    }
#elif defined(MBEDTLS_SHA256_C)
    if (is224 != 0) {
        return MBEDTLS_ERR_SHA256_BAD_INPUT_DATA;
    }
#else /* defined MBEDTLS_SHA224_C only */
    if (is224 == 0) {
        return MBEDTLS_ERR_SHA256_BAD_INPUT_DATA;
    }
#endif

    mbedtls_sha256_init(&ctx);

    if ((ret = mbedtls_sha256_starts(&ctx, is224)) != 0) {
        goto exit;
    }

    if ((ret = mbedtls_sha256_update(&ctx, input, ilen)) != 0) {
        goto exit;
    }

    if ((ret = mbedtls_sha256_finish(&ctx, output)) != 0) {
        goto exit;
    }

exit:
    mbedtls_sha256_free(&ctx);

    return ret;
}